

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpcbuilder.cpp
# Opt level: O0

void __thiscall DPCResult::build(DPCResult *this,string *source,string *pathOut)

{
  FILE *file_00;
  bool bVar1;
  char *pcVar2;
  runtime_error *prVar3;
  DIR *__dirp;
  long lVar4;
  undefined1 local_188 [4];
  uint32_t post;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  int local_124;
  undefined4 local_120;
  uint32_t pre;
  undefined1 local_118 [8];
  string childPath;
  dirent *entry;
  DIR *dir;
  string local_e0;
  string local_c0;
  FILE *local_a0;
  FILE *file;
  string local_90;
  string local_70;
  string local_40;
  string *local_20;
  string *pathOut_local;
  string *source_local;
  DPCResult *this_local;
  
  local_20 = pathOut;
  pathOut_local = source;
  source_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)source);
  bVar1 = isADirectory(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    file._6_1_ = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_90,"%s is not a directory!\n",(allocator *)((long)&file + 7));
    pcVar2 = (char *)std::__cxx11::string::c_str();
    formatString<char_const*>(&local_70,&local_90,pcVar2);
    std::runtime_error::runtime_error(prVar3,(string *)&local_70);
    file._6_1_ = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_a0 = fopen(pcVar2,"wb");
  if (local_a0 != (FILE *)0x0) {
    writeDPCMagic(this,(FILE *)local_a0);
    writeHeader(this,(FILE *)local_a0);
    childPath.field_2._8_8_ = 0;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    __dirp = opendir(pcVar2);
    while (childPath.field_2._8_8_ = readdir(__dirp),
          (dirent *)childPath.field_2._8_8_ != (dirent *)0x0) {
      pcVar2 = ((dirent *)childPath.field_2._8_8_)->d_name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_118,pcVar2,(allocator *)((long)&pre + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&pre + 3));
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_118,".");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_118,".."), bVar1)) {
        local_120 = 2;
      }
      else {
        lVar4 = ftell(local_a0);
        file_00 = local_a0;
        local_124 = (int)lVar4;
        std::__cxx11::string::string((string *)local_188,(string *)source);
        trailFolder(&local_168,(string *)local_188);
        std::operator+(&local_148,&local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118);
        writeFolder(this,(FILE *)file_00,&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)local_188);
        lVar4 = ftell(local_a0);
        writePadding(this,(FILE *)local_a0,this->m_blockSize + (local_124 - (int)lVar4));
        local_120 = 0;
      }
      std::__cxx11::string::~string((string *)local_118);
    }
    closedir(__dirp);
    fclose(local_a0);
    return;
  }
  dir._6_1_ = 1;
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e0,"Couldn\'t open %s for writing!\n",(allocator *)((long)&dir + 7));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  formatString<char_const*>(&local_c0,&local_e0,pcVar2);
  std::runtime_error::runtime_error(prVar3,(string *)&local_c0);
  dir._6_1_ = 0;
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DPCResult::build(std::string source, std::string pathOut){
    if(!isADirectory(source))
        throw NOT_A_DIR(source.c_str());
    FILE *file = fopen(pathOut.c_str(),"wb");
    if(file == nullptr)
        throw CANT_WRITE(pathOut.c_str());
    writeDPCMagic(file);
    writeHeader(file);

    DIR *dir = nullptr;
    struct dirent *entry = nullptr;
    dir = opendir(source.c_str());
    while( (entry=readdir(dir))){
        std::string childPath = entry->d_name;
        if (childPath=="." || childPath == "..")
            continue;
        uint32_t pre = ftell(file);
        writeFolder(file,trailFolder(source)+childPath);
        uint32_t post = ftell(file);
        writePadding(file, m_blockSize-(post-pre));
    }
    closedir(dir);
    fclose(file);
}